

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scgi_api.cpp
# Opt level: O3

void __thiscall cppcms::impl::cgi::scgi::set_response_headers(scgi *this,response_headers *hdr)

{
  string local_30;
  
  connection::format_xcgi_response_headers_abi_cxx11_(&local_30,&this->super_connection,hdr);
  std::__cxx11::string::operator=((string *)&this->headers_,(string *)&local_30);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_30._M_dataplus._M_p != &local_30.field_2) {
    operator_delete(local_30._M_dataplus._M_p);
  }
  this->headers_written_ = false;
  return;
}

Assistant:

virtual void set_response_headers(cppcms::impl::response_headers &hdr)
		{
			headers_ = std::move(format_xcgi_response_headers(hdr));
			headers_written_ = false;
		}